

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-msg.c
# Opt level: O2

wchar_t get_pain_msg_code(monster_conflict *mon,wchar_t dam)

{
  wchar_t wVar1;
  long lVar2;
  
  if (dam < L'\x01') {
    wVar1 = L'5';
  }
  else {
    lVar2 = ((long)mon->hp * 100) / (long)((ulong)(uint)dam + (long)mon->hp);
    if (lVar2 < 0x60) {
      if (lVar2 < 0x4c) {
        if (lVar2 < 0x33) {
          if (lVar2 < 0x24) {
            if (lVar2 < 0x15) {
              return (uint)(lVar2 < 0xb) + L'?';
            }
            wVar1 = L'>';
          }
          else {
            wVar1 = L'=';
          }
        }
        else {
          wVar1 = L'<';
        }
      }
      else {
        wVar1 = L';';
      }
    }
    else {
      wVar1 = L':';
    }
  }
  return wVar1;
}

Assistant:

static int get_pain_msg_code(struct monster *mon, int dam)
{
	int msg_code = MON_MSG_UNHARMED;

	/* Calculate damage levels */
	if (dam > 0) {
		/* Note -- subtle fix -CFT */
		long newhp = (long)(mon->hp);
		long oldhp = newhp + (long)(dam);
		long tmp = (newhp * 100L) / oldhp;
		int percentage = (int)(tmp);

		if (percentage > 95)		msg_code = MON_MSG_95;
		else if (percentage > 75)	msg_code = MON_MSG_75;
		else if (percentage > 50)	msg_code = MON_MSG_50;
		else if (percentage > 35)	msg_code = MON_MSG_35;
		else if (percentage > 20)	msg_code = MON_MSG_20;
		else if (percentage > 10)	msg_code = MON_MSG_10;
		else				msg_code = MON_MSG_0;
	}
	return msg_code;
}